

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deblock.c
# Opt level: O3

void deblock_edge_luma_ver(pel *src,int stride,int Alpha,int Beta,int edge_flag)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  byte *pbVar13;
  int iVar14;
  byte *pbVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint local_60;
  
  iVar6 = (uint)((~edge_flag & 0x101U) == 0) * 4 + 4;
  iVar16 = 0;
  if ((edge_flag & 1U) == 0) {
    iVar16 = stride * 4;
  }
  pbVar15 = src + iVar16;
  iVar16 = Beta + 3;
  if (-1 < Beta) {
    iVar16 = Beta;
  }
  do {
    bVar8 = pbVar15[-3];
    bVar1 = pbVar15[-2];
    bVar2 = pbVar15[-1];
    uVar11 = (uint)bVar2;
    bVar3 = *pbVar15;
    uVar20 = (uint)bVar3;
    bVar4 = pbVar15[1];
    bVar5 = pbVar15[2];
    uVar9 = uVar20 - bVar2;
    uVar7 = -uVar9;
    if (0 < (int)uVar9) {
      uVar7 = uVar9;
    }
    uVar10 = (uint)bVar1 - (uint)bVar2;
    uVar9 = -uVar10;
    if (0 < (int)uVar10) {
      uVar9 = uVar10;
    }
    uVar18 = (uint)bVar3 - (uint)bVar4;
    uVar10 = -uVar18;
    if (0 < (int)uVar18) {
      uVar10 = uVar18;
    }
    uVar12 = (uint)bVar2;
    uVar17 = bVar8 - uVar12;
    uVar18 = -uVar17;
    if (0 < (int)uVar17) {
      uVar18 = uVar17;
    }
    uVar21 = (uint)bVar3;
    uVar22 = uVar21 - bVar5;
    uVar17 = -uVar22;
    if (0 < (int)uVar22) {
      uVar17 = uVar22;
    }
    iVar14 = (uint)((int)(uVar18 & 0xff) < Beta) + (uint)((int)(uVar9 & 0xff) < Beta) * 2;
    iVar19 = (uint)((int)(uVar17 & 0xff) < Beta) + iVar14 + (uint)((int)(uVar10 & 0xff) < Beta) * 2;
    if (3 < iVar19 - 3U) goto LAB_00114b06;
    uVar9 = (uint)bVar3;
    uVar18 = (uint)bVar1;
    pbVar13 = pbVar15;
    switch(iVar19) {
    case 3:
      local_60 = (uint)bVar4;
      iVar19 = uVar18 - local_60;
      iVar14 = -iVar19;
      if (0 < iVar19) {
        iVar14 = iVar19;
      }
      if (Beta <= iVar14) goto LAB_00114b06;
LAB_00114ae4:
      pbVar15[-1] = (byte)(uVar11 * 3 + uVar9 + 2 >> 2);
      bVar8 = (byte)(uVar20 * 3 + (uint)bVar2 + 2 >> 2);
      break;
    case 4:
      if (iVar14 != 2) goto LAB_00114ae4;
      goto LAB_00114aac;
    case 5:
      if (bVar2 == bVar1 && bVar4 == bVar3) goto LAB_00114a35;
LAB_00114aac:
      pbVar15[-1] = (byte)((uint)bVar1 + (uint)bVar1 * 2 + uVar9 + uVar11 * 10 + uVar20 * 2 + 8 >> 4
                          );
      bVar8 = (byte)(uVar11 * 3 + uVar20 * 10 + (uint)bVar4 * 3 + 8 >> 4);
      break;
    case 6:
      if ((int)(uVar10 & 0xff) <= iVar16 >> 2) {
        uVar17 = uVar12 - bVar1;
        uVar10 = -uVar17;
        if (0 < (int)uVar17) {
          uVar10 = uVar17;
        }
        if ((uVar10 <= (uint)(iVar16 >> 2)) && ((int)(uVar7 & 0xff) < Alpha)) {
          iVar14 = (uint)bVar1 + (uint)bVar8;
          pbVar15[-3] = (byte)(uVar11 + ((uint)pbVar15[-4] + iVar14) * 2 + uVar21 + 4 >> 3);
          pbVar15[-2] = (byte)(uVar20 * 3 + uVar18 + (iVar14 + uVar12) * 4 + 8 >> 4);
          uVar7 = (uint)bVar4;
          iVar14 = uVar12 + uVar21;
          pbVar15[-1] = (byte)((bVar8 + uVar7) * 3 + ((uint)bVar1 + iVar14) * 8 + uVar11 * 2 + 0x10
                              >> 5);
          uVar9 = (uint)bVar5;
          *pbVar15 = (byte)((uVar18 + uVar9) * 3 + (uVar7 + iVar14) * 8 + uVar20 * 2 + 0x10 >> 5);
          pbVar15[1] = (byte)(uVar11 * 3 + (uint)bVar4 + (uVar21 + uVar7 + uVar9) * 4 + 8 >> 4);
          bVar8 = (byte)(iVar14 + 4 + (uVar9 + bVar4 + (uint)pbVar15[3]) * 2 >> 3);
          pbVar13 = pbVar15 + 2;
          break;
        }
      }
LAB_00114a35:
      pbVar15[-2] = (byte)((uint)bVar8 * 3 + (uint)bVar2 * 4 + 8 + (uint)bVar1 * 8 + uVar9 >> 4);
      pbVar15[-1] = (byte)((uint)bVar8 + (uint)bVar1 * 4 + (uint)bVar2 * 4 + 8 + (uint)bVar2 * 2 +
                           (uint)bVar3 * 4 + (uint)bVar4 >> 4);
      *pbVar15 = (byte)((uint)bVar1 + (uint)bVar2 * 4 + 8 + uVar20 * 6 + (uint)bVar4 * 4 +
                        (uint)bVar5 >> 4);
      bVar8 = (byte)((uint)bVar5 + (uint)bVar5 * 2 + uVar11 + uVar20 * 4 + (uint)bVar4 * 8 + 8 >> 4)
      ;
      pbVar13 = pbVar15 + 1;
    }
    *pbVar13 = bVar8;
LAB_00114b06:
    pbVar15 = pbVar15 + stride;
    iVar6 = iVar6 + -1;
    if (iVar6 == 0) {
      return;
    }
  } while( true );
}

Assistant:

void deblock_edge_luma_ver(pel *src, int stride, int Alpha, int Beta, int edge_flag)
{
    int i, line_size = 8;

    if ((edge_flag & 0x0101) != 0x0101) {
        line_size = 4;
    }
    if (!(edge_flag & 0x1)) {
        src += 4 * stride;
    }

    for (i = 0; i < line_size; i++, src += stride) {
        int L3 = src[-4];
        int L2 = src[-3];
        int L1 = src[-2];
        int L0 = src[-1];
        int R0 = src[0];
        int R1 = src[1];
        int R2 = src[2];
        int R3 = src[3];
        int abs0 = COM_ABS(R0 - L0);
        int flat_l = (COM_ABS(L1 - L0) < Beta) ? 2 : 0;
        int flat_r = (COM_ABS(R0 - R1) < Beta) ? 2 : 0;
        int fs;

        if (COM_ABS(L2 - L0) < Beta) {
            flat_l++;
        }
        if (COM_ABS(R0 - R2) < Beta) {
            flat_r++;
        }

        switch (flat_l + flat_r) {
        case 6:
            fs = (COM_ABS(R0 - R1) <= Beta / 4 && COM_ABS(L0 - L1) <= Beta / 4 && abs0 < Alpha) ? 4 : 3;
            break;
        case 5:
            fs = (R1 == R0 && L0 == L1) ? 3 : 2;
            break;
        case 4:
            fs = (flat_l == 2) ? 2 : 1;
            break;
        case 3:
            fs = (COM_ABS(L1 - R1) < Beta) ? 1 : 0;
            break;
        default:
            fs = 0;
            break;
        }

        switch (fs) {
        case 4:
            src[-3] = (pel)((((L3 + L2 + L1) << 1) + L0 + R0 + 4) >> 3);                          //L2
            src[-2] = (pel)((((L2 + L0 + L1) << 2) + L1 + R0 * 3 + 8) >> 4);                      //L1
            src[-1] = (pel)(((L2 + R1) * 3 + ((L1 + L0 + R0) << 3) + (L0 << 1) + 16) >> 5);       //L0
            src[ 0] = (pel)(((R2 + L1) * 3 + ((R1 + R0 + L0) << 3) + (R0 << 1) + 16) >> 5);       //R0
            src[ 1] = (pel)((((R2 + R1 + R0) << 2) + R1 + L0 * 3 + 8) >> 4);                      //R1
            src[ 2] = (pel)((((R3 + R2 + R1) << 1) + R0 + L0 + 4) >> 3);                          //R2
            break;
        case 3:
            src[-2] = (pel)((L2 * 3 + L1 * 8 + L0 * 4 + R0 + 8) >> 4);                           //L1
            src[-1] = (pel)((L2 + (L1 << 2) + (L0 << 2) + (L0 << 1) + (R0 << 2) + R1 + 8) >> 4); //L0
            src[ 0] = (pel)((L1 + (L0 << 2) + (R0 << 2) + (R0 << 1) + (R1 << 2) + R2 + 8) >> 4); //R0
            src[ 1] = (pel)((R2 * 3 + R1 * 8 + R0 * 4 + L0 + 8) >> 4);                           //R1
            break;
        case 2:
            src[-1] = (pel)(((L1 << 1) + L1 + (L0 << 3) + (L0 << 1) + (R0 << 1) + R0 + 8) >> 4);
            src[ 0] = (pel)(((L0 << 1) + L0 + (R0 << 3) + (R0 << 1) + (R1 << 1) + R1 + 8) >> 4);
            break;
        case 1:
            src[-1] = (pel)((L0 * 3 + R0 + 2) >> 2);
            src[ 0] = (pel)((R0 * 3 + L0 + 2) >> 2);
            break;
        default:
            break;
        }
    }
}